

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitLoad(ParseNode *lhs,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  OpCode OVar1;
  RegSlot RVar2;
  RegSlot Instance;
  Symbol *sym;
  ParseNode *pnode;
  code *pcVar3;
  bool bVar4;
  PropertyId propertySlot;
  uint cacheId_00;
  uint uVar5;
  ParseNodeName *pPVar6;
  ByteCodeWriter *pBVar7;
  ParseNodeBin *pPVar8;
  ParseNodeCall *pnodeCall;
  ParseNodeSuperCall *pnodeSuperCall;
  undefined4 *puVar9;
  ParseNodePtr args;
  ParseNodeCall *pnodeCallLhs;
  uint cacheId;
  PropertyId propertyId;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *lhs_local;
  
  OVar1 = lhs->nop;
  if (OVar1 == knopName) {
    FuncInfo::AcquireLoc(funcInfo,lhs);
    RVar2 = lhs->location;
    pPVar6 = ParseNode::AsParseNodeName(lhs);
    sym = pPVar6->sym;
    pPVar6 = ParseNode::AsParseNodeName(lhs);
    ByteCodeGenerator::EmitPropLoad(byteCodeGenerator,RVar2,sym,pPVar6->pid,funcInfo,false);
  }
  else if (OVar1 == knopCall) {
    pnodeCall = ParseNode::AsParseNodeCall(lhs);
    if (((byte)pnodeCall->field_0x24 >> 3 & 1) == 0) {
      if (pnodeCall->pnodeTarget->nop == knopImport) {
        pnode = pnodeCall->pnodeArgs;
        uVar5 = CountArguments(pnode,(BOOL *)0x0);
        if (uVar5 != 2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x1cd3,"(CountArguments(args) == 2)","CountArguments(args) == 2");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
        FuncInfo::ReleaseLoc(funcInfo,pnode);
        FuncInfo::AcquireLoc(funcInfo,&pnodeCall->super_ParseNode);
        pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::Reg2
                  (pBVar7,ImportCall,(pnodeCall->super_ParseNode).location,pnode->location);
      }
      else {
        FuncInfo::AcquireLoc(funcInfo,&pnodeCall->super_ParseNode);
        EmitReference(&pnodeCall->super_ParseNode,byteCodeGenerator,funcInfo);
        EmitCall(pnodeCall,byteCodeGenerator,funcInfo,0,0,0xffffffff,0xffffffff);
      }
    }
    else {
      FuncInfo::AcquireLoc(funcInfo,&pnodeCall->super_ParseNode);
      EmitReference(&pnodeCall->super_ParseNode,byteCodeGenerator,funcInfo);
      pnodeSuperCall = ParseNode::AsParseNodeSuperCall(&pnodeCall->super_ParseNode);
      ByteCodeGenerator::EmitSuperCall(byteCodeGenerator,funcInfo,pnodeSuperCall,0,0);
    }
  }
  else if (OVar1 == knopDot) {
    pPVar8 = ParseNode::AsParseNodeBin(lhs);
    pPVar6 = ParseNode::AsParseNodeName(pPVar8->pnode2);
    propertySlot = ParseNodeName::PropertyIdFromNameNode(pPVar6);
    FuncInfo::AcquireLoc(funcInfo,lhs);
    EmitReference(lhs,byteCodeGenerator,funcInfo);
    pPVar8 = ParseNode::AsParseNodeBin(lhs);
    cacheId_00 = FuncInfo::FindOrAddInlineCacheId
                           (funcInfo,pPVar8->pnode1->location,propertySlot,false,false);
    pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
    RVar2 = lhs->location;
    pPVar8 = ParseNode::AsParseNodeBin(lhs);
    Js::ByteCodeWriter::PatchableProperty
              (pBVar7,LdFld,RVar2,pPVar8->pnode1->location,cacheId_00,false,true);
  }
  else if (OVar1 == knopIndex) {
    FuncInfo::AcquireLoc(funcInfo,lhs);
    EmitReference(lhs,byteCodeGenerator,funcInfo);
    pBVar7 = ByteCodeGenerator::Writer(byteCodeGenerator);
    RVar2 = lhs->location;
    pPVar8 = ParseNode::AsParseNodeBin(lhs);
    Instance = pPVar8->pnode1->location;
    pPVar8 = ParseNode::AsParseNodeBin(lhs);
    Js::ByteCodeWriter::Element
              (pBVar7,LdElemI_A,RVar2,Instance,pPVar8->pnode2->location,false,false);
  }
  else {
    FuncInfo::AcquireLoc(funcInfo,lhs);
    Emit(lhs,byteCodeGenerator,funcInfo,0,false,false);
  }
  return;
}

Assistant:

void EmitLoad(
    ParseNode *lhs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    // Emit the instructions to load the value into the LHS location. Do not assign/free any temps
    // in the process.
    // We usually get here as part of an op-equiv expression: x.y += z;
    // In such a case, x has to be emitted first, then the value of x.y loaded (by this function), then z emitted.
    switch (lhs->nop)
    {

        // load of a local or global variable
    case knopName:
    {
        funcInfo->AcquireLoc(lhs);
        byteCodeGenerator->EmitPropLoad(lhs->location, lhs->AsParseNodeName()->sym, lhs->AsParseNodeName()->pid, funcInfo);
        break;
    }

    // = x.y
    case knopDot:
    {
        // get field id for "y"
        Js::PropertyId propertyId = lhs->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode();
        funcInfo->AcquireLoc(lhs);
        EmitReference(lhs, byteCodeGenerator, funcInfo);
        uint cacheId = funcInfo->FindOrAddInlineCacheId(lhs->AsParseNodeBin()->pnode1->location, propertyId, false, false);
        byteCodeGenerator->Writer()->PatchableProperty(Js::OpCode::LdFld, lhs->location, lhs->AsParseNodeBin()->pnode1->location, cacheId);
        break;
    }

    case knopIndex:
        funcInfo->AcquireLoc(lhs);
        EmitReference(lhs, byteCodeGenerator, funcInfo);
        byteCodeGenerator->Writer()->Element(
            Js::OpCode::LdElemI_A, lhs->location, lhs->AsParseNodeBin()->pnode1->location, lhs->AsParseNodeBin()->pnode2->location);
        break;

        // f(x) +=
    case knopCall:
    {
        ParseNodeCall * pnodeCallLhs = lhs->AsParseNodeCall();

        if (pnodeCallLhs->isSuperCall)
        {
            funcInfo->AcquireLoc(pnodeCallLhs);
            EmitReference(pnodeCallLhs, byteCodeGenerator, funcInfo);
            byteCodeGenerator->EmitSuperCall(funcInfo, pnodeCallLhs->AsParseNodeSuperCall(), /*fReturnValue=*/ false, /*fEvaluateComponents=*/ false);
        }
        else if (pnodeCallLhs->pnodeTarget->nop == knopImport)
        {
            ParseNodePtr args = pnodeCallLhs->pnodeArgs;
            Assert(CountArguments(args) == 2); // import() takes one argument
            Emit(args, byteCodeGenerator, funcInfo, false);
            funcInfo->ReleaseLoc(args);
            funcInfo->AcquireLoc(pnodeCallLhs);
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::ImportCall, pnodeCallLhs->location, args->location);
        }
        else
        {
            funcInfo->AcquireLoc(pnodeCallLhs);
            EmitReference(pnodeCallLhs, byteCodeGenerator, funcInfo);
            EmitCall(pnodeCallLhs, byteCodeGenerator, funcInfo, /*fReturnValue=*/ false, /*fEvaluateComponents=*/ false);
        }
        break;
    }
    default:
        funcInfo->AcquireLoc(lhs);
        Emit(lhs, byteCodeGenerator, funcInfo, false);
        break;
    }
}